

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O2

int Wln_NtkIsAcyclic(Wln_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  FILE *pFVar8;
  
  Wln_NtkIncrementTravId(p);
  Wln_NtkIncrementTravId(p);
  iVar6 = 0;
  do {
    if ((p->vCos).nSize <= iVar6) {
      iVar6 = 0;
      goto LAB_0031c9a7;
    }
    uVar1 = Vec_IntEntry(&p->vCos,iVar6);
    iVar2 = Wln_NtkIsAcyclic_rec(p,uVar1);
    pFVar8 = _stdout;
    iVar6 = iVar6 + 1;
  } while (iVar2 != 0);
  pcVar5 = Wln_ObjName(p,uVar1);
  pcVar7 = "Primary output %16s (ID %6d)\n";
  goto LAB_0031c9e5;
  while( true ) {
    uVar1 = Vec_IntEntry(&p->vFfs,iVar6);
    iVar2 = Wln_NtkIsAcyclic_rec(p,uVar1);
    pFVar8 = _stdout;
    iVar6 = iVar6 + 1;
    if (iVar2 == 0) break;
LAB_0031c9a7:
    if ((p->vFfs).nSize <= iVar6) {
      uVar1 = 0;
      for (iVar6 = 1; iVar6 < (p->vTypes).nSize; iVar6 = iVar6 + 1) {
        iVar2 = Wln_ObjIsTravIdPrevious(p,iVar6);
        uVar3 = 0;
        if (iVar2 == 0) {
          uVar3 = Wln_ObjIsCi(p,iVar6);
          uVar3 = uVar3 ^ 1;
        }
        uVar1 = uVar1 + uVar3;
      }
      if (uVar1 == 0) {
        return 1;
      }
      Wln_NtkCreateRefs(p);
      uVar3 = (p->vTypes).nSize;
      printf("The network has %d objects and %d (%6.2f %%) of them are not connected to the outputs.\n"
             ,((double)(int)uVar1 * 100.0) / (double)(int)uVar3,(ulong)uVar3,(ulong)uVar1);
      uVar1 = 0;
      for (iVar6 = 1; iVar6 < (p->vTypes).nSize; iVar6 = iVar6 + 1) {
        iVar2 = Vec_IntEntry(&p->vRefs,iVar6);
        if (((iVar2 == 0) && (iVar2 = Wln_ObjIsCi(p,iVar6), iVar2 == 0)) &&
           (iVar2 = Wln_ObjIsCo(p,iVar6), iVar2 == 0)) {
          uVar3 = Wln_ObjIsFf(p,iVar6);
          uVar1 = uVar1 + (uVar3 ^ 1);
        }
      }
      if (uVar1 == 0) goto LAB_0031cbe1;
      printf("These unconnected objects feed into %d sink objects without fanout:\n",(ulong)uVar1);
      uVar3 = 1;
      iVar6 = 0;
      do {
        if ((p->vTypes).nSize <= (int)uVar3) {
LAB_0031cbd0:
          if (iVar6 < (int)uVar1) {
            puts("...");
          }
LAB_0031cbe1:
          iVar6 = 1;
          while( true ) {
            if ((p->vTypes).nSize <= iVar6) {
              return 1;
            }
            iVar2 = Wln_ObjIsTravIdPrevious(p,iVar6);
            if (((iVar2 == 0) && (iVar2 = Wln_ObjIsCi(p,iVar6), iVar2 == 0)) &&
               (iVar2 = Wln_NtkIsAcyclic_rec(p,iVar6), pFVar8 = _stdout, iVar2 == 0)) break;
            iVar6 = iVar6 + 1;
          }
          pcVar5 = Wln_ObjName(p,iVar6);
          fprintf(pFVar8,"Unconnected object %s\n",pcVar5);
          return 0;
        }
        iVar2 = Vec_IntEntry(&p->vRefs,uVar3);
        if (((iVar2 == 0) && (iVar2 = Wln_ObjIsCi(p,uVar3), iVar2 == 0)) &&
           ((iVar2 = Wln_ObjIsCo(p,uVar3), iVar2 == 0 &&
            (iVar2 = Wln_ObjIsFf(p,uVar3), pFVar8 = _stdout, iVar2 == 0)))) {
          pcVar5 = Wln_ObjName(p,uVar3);
          iVar2 = Vec_IntEntry(&p->vTypes,uVar3);
          pcVar7 = Abc_OperName(iVar2);
          uVar4 = Vec_IntEntry(&p->vTypes,uVar3);
          fprintf(pFVar8,"Node %16s (ID %6d) of type %5s (type ID %2d)\n",pcVar5,(ulong)uVar3,pcVar7
                  ,(ulong)uVar4);
          iVar6 = iVar6 + 1;
          if (iVar6 == 5) {
            iVar6 = 5;
            goto LAB_0031cbd0;
          }
        }
        uVar3 = uVar3 + 1;
      } while( true );
    }
  }
  pcVar5 = Wln_ObjName(p,uVar1);
  pcVar7 = "Flip-flop %16s (ID %6d)\n";
LAB_0031c9e5:
  fprintf(pFVar8,pcVar7,pcVar5,(ulong)uVar1);
  return 0;
}

Assistant:

int Wln_NtkIsAcyclic( Wln_Ntk_t * p )
{
    int fAcyclic, i, iObj, nUnvisited = 0 ;
    // set the traversal ID for this DFS ordering
    Wln_NtkIncrementTravId( p );   
    Wln_NtkIncrementTravId( p );   
    // iObj->TravId == pNet->nTravIds      means "iObj is on the path"
    // iObj->TravId == pNet->nTravIds - 1  means "iObj is visited but is not on the path"
    // iObj->TravId <  pNet->nTravIds - 1  means "iObj is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Wln_NtkForEachCo( p, iObj, i )
    {
        // traverse the output logic cone
        if ( (fAcyclic = Wln_NtkIsAcyclic_rec(p, iObj)) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, "Primary output %16s (ID %6d)\n", Wln_ObjName(p, iObj), iObj );
        goto finish;
    }
    Wln_NtkForEachFf( p, iObj, i )
    {
        // traverse the output logic cone
        if ( (fAcyclic = Wln_NtkIsAcyclic_rec(p, iObj)) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, "Flip-flop %16s (ID %6d)\n", Wln_ObjName(p, iObj), iObj );
        goto finish;
    }
    Wln_NtkForEachObj( p, iObj )
        nUnvisited += !Wln_ObjIsTravIdPrevious(p, iObj) && !Wln_ObjIsCi(p, iObj);
    if ( nUnvisited )
    {
        int nSinks = 0;
        Wln_NtkCreateRefs(p);
        printf( "The network has %d objects and %d (%6.2f %%) of them are not connected to the outputs.\n", 
            Wln_NtkObjNum(p), nUnvisited, 100.0*nUnvisited/Wln_NtkObjNum(p) );
        Wln_NtkForEachObj( p, iObj )
            if ( !Wln_ObjRefs(p, iObj) && !Wln_ObjIsCi(p, iObj) && !Wln_ObjIsCo(p, iObj) && !Wln_ObjIsFf(p, iObj) )
                nSinks++;
        if ( nSinks )
        {
            int nPrinted = 0;
            printf( "These unconnected objects feed into %d sink objects without fanout:\n", nSinks );
            Wln_NtkForEachObj( p, iObj )
                if ( !Wln_ObjRefs(p, iObj) && !Wln_ObjIsCi(p, iObj) && !Wln_ObjIsCo(p, iObj) && !Wln_ObjIsFf(p, iObj) )
                {
                    fprintf( stdout, "Node %16s (ID %6d) of type %5s (type ID %2d)\n", 
                        Wln_ObjName(p, iObj), iObj, Abc_OperName(Wln_ObjType(p, iObj)), Wln_ObjType(p, iObj) );
                    if ( ++nPrinted == 5 )
                        break;
                }
            if ( nPrinted < nSinks )
                printf( "...\n" );
        }
        Wln_NtkForEachObj( p, iObj )
            if ( /*!Wln_ObjRefs(p, iObj) &&*/ !Wln_ObjIsTravIdPrevious(p, iObj) && !Wln_ObjIsCi(p, iObj) )
            {
                // traverse the output logic cone
                if ( (fAcyclic = Wln_NtkIsAcyclic_rec(p, iObj)) )
                    continue;
                // stop as soon as the first loop is detected
                fprintf( stdout, "Unconnected object %s\n", Wln_ObjName(p, iObj) );
                goto finish;
            }
    }
finish:
    return fAcyclic;
}